

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_lookup.c
# Opt level: O0

void test_write_disk_lookup(void)

{
  wchar_t wVar1;
  int iVar2;
  la_int64_t lVar3;
  longlong local_20;
  int64_t id;
  int umagic;
  int gmagic;
  archive *a;
  
  id._4_4_ = 0x13579;
  id._0_4_ = 0x1234;
  _umagic = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                   ,L'K',(uint)(_umagic != (archive *)0x0),"(a = archive_write_disk_new()) != NULL",
                   (void *)0x0);
  lVar3 = archive_write_disk_gid(_umagic,"",0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'N',0,"0",lVar3,"archive_write_disk_gid(a, \"\", 0)",(void *)0x0);
  lVar3 = archive_write_disk_gid(_umagic,"root",0xc);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'O',0xc,"12",lVar3,"archive_write_disk_gid(a, \"root\", 12)",(void *)0x0);
  lVar3 = archive_write_disk_gid(_umagic,"wheel",0xc);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'P',0xc,"12",lVar3,"archive_write_disk_gid(a, \"wheel\", 12)",(void *)0x0);
  lVar3 = archive_write_disk_uid(_umagic,"",0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'Q',0,"0",lVar3,"archive_write_disk_uid(a, \"\", 0)",(void *)0x0);
  lVar3 = archive_write_disk_uid(_umagic,"root",0x12);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'R',0x12,"18",lVar3,"archive_write_disk_uid(a, \"root\", 18)",(void *)0x0);
  wVar1 = archive_write_disk_set_group_lookup
                    (_umagic,(void *)((long)&id + 4),group_lookup,group_cleanup);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'V',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_write_disk_set_group_lookup(a, &gmagic, &group_lookup, &group_cleanup)"
                      ,(void *)0x0);
  lVar3 = archive_write_disk_gid(_umagic,"FOOGROUP",8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'X',0x49,"73",lVar3,"archive_write_disk_gid(a, \"FOOGROUP\", 8)",(void *)0x0
                     );
  lVar3 = archive_write_disk_gid(_umagic,"NOTFOOGROUP",8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'Y',1,"1",lVar3,"archive_write_disk_gid(a, \"NOTFOOGROUP\", 8)",(void *)0x0)
  ;
  wVar1 = archive_write_disk_set_group_lookup
                    (_umagic,(void *)0x0,(_func_la_int64_t_void_ptr_char_ptr_la_int64_t *)0x0,
                     (_func_void_void_ptr *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L']',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_write_disk_set_group_lookup(a, NULL, NULL, NULL)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'_',(long)id._4_4_,"gmagic",0x2468,"0x2468",(void *)0x0);
  wVar1 = archive_write_disk_set_user_lookup(_umagic,&id,user_lookup,user_cleanup);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'c',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_write_disk_set_user_lookup(a, &umagic, &user_lookup, &user_cleanup)",
                      (void *)0x0);
  lVar3 = archive_write_disk_uid(_umagic,"FOO",0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'd',2,"2",lVar3,"archive_write_disk_uid(a, \"FOO\", 0)",(void *)0x0);
  lVar3 = archive_write_disk_uid(_umagic,"NOTFOO",1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'e',0x4a,"74",lVar3,"archive_write_disk_uid(a, \"NOTFOO\", 1)",(void *)0x0);
  wVar1 = archive_write_disk_set_user_lookup
                    (_umagic,(void *)0x0,(_func_int64_t_void_ptr_char_ptr_int64_t *)0x0,
                     (_func_void_void_ptr *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'g',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_write_disk_set_user_lookup(a, NULL, NULL, NULL)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'h',(long)(int)id,"umagic",0x2345,"0x2345",(void *)0x0);
  iVar2 = archive_write_disk_set_standard_lookup(_umagic);
  if (iVar2 == 0) {
    local_20 = archive_write_disk_gid(_umagic,"wheel",8);
    if (local_20 != 0) {
      local_20 = archive_write_disk_gid(_umagic,"root",8);
    }
    failure("Unable to verify lookup of group #0");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                        ,L'w',0,"0",local_20,"id",(void *)0x0);
    lVar3 = archive_write_disk_uid(_umagic,"root",8);
    failure("Unable to verify lookup of user #0");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                        ,L'\x81',0,"0",lVar3,"id",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                   ,L'l');
    test_skipping("standard uname/gname lookup");
  }
  wVar1 = archive_write_disk_set_group_lookup
                    (_umagic,(void *)0x0,(_func_la_int64_t_void_ptr_char_ptr_la_int64_t *)0x0,
                     (_func_void_void_ptr *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'\x87',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_write_disk_set_group_lookup(a, NULL, NULL, NULL)",(void *)0x0);
  wVar1 = archive_write_disk_set_user_lookup
                    (_umagic,(void *)0x0,(_func_int64_t_void_ptr_char_ptr_int64_t *)0x0,
                     (_func_void_void_ptr *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'\x89',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_write_disk_set_user_lookup(a, NULL, NULL, NULL)",(void *)0x0);
  lVar3 = archive_write_disk_gid(_umagic,"",0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'\x8a',0,"0",lVar3,"archive_write_disk_gid(a, \"\", 0)",(void *)0x0);
  lVar3 = archive_write_disk_uid(_umagic,"",0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'\x8b',0,"0",lVar3,"archive_write_disk_uid(a, \"\", 0)",(void *)0x0);
  id._4_4_ = 0x13579;
  id._0_4_ = 0x1234;
  wVar1 = archive_write_disk_set_group_lookup
                    (_umagic,(void *)((long)&id + 4),group_lookup,group_cleanup);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'\x91',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_write_disk_set_group_lookup(a, &gmagic, &group_lookup, &group_cleanup)"
                      ,(void *)0x0);
  wVar1 = archive_write_disk_set_user_lookup(_umagic,&id,user_lookup,user_cleanup);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'\x93',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_write_disk_set_user_lookup(a, &umagic, &user_lookup, &user_cleanup)",
                      (void *)0x0);
  iVar2 = archive_read_free(_umagic);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'\x96',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'\x99',(long)id._4_4_,"gmagic",0x2468,"0x2468",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'\x9a',(long)(int)id,"umagic",0x2345,"0x2345",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_lookup)
{
	struct archive *a;
	int gmagic = 0x13579, umagic = 0x1234;
	int64_t id;

	assert((a = archive_write_disk_new()) != NULL);

	/* Default uname/gname lookups always return ID. */
	assertEqualInt(0, archive_write_disk_gid(a, "", 0));
	assertEqualInt(12, archive_write_disk_gid(a, "root", 12));
	assertEqualInt(12, archive_write_disk_gid(a, "wheel", 12));
	assertEqualInt(0, archive_write_disk_uid(a, "", 0));
	assertEqualInt(18, archive_write_disk_uid(a, "root", 18));

	/* Register some weird lookup functions. */
	assertEqualInt(ARCHIVE_OK, archive_write_disk_set_group_lookup(a,
		       &gmagic, &group_lookup, &group_cleanup));
	/* Verify that our new function got called. */
	assertEqualInt(73, archive_write_disk_gid(a, "FOOGROUP", 8));
	assertEqualInt(1, archive_write_disk_gid(a, "NOTFOOGROUP", 8));

	/* De-register. */
	assertEqualInt(ARCHIVE_OK,
		       archive_write_disk_set_group_lookup(a, NULL, NULL, NULL));
	/* Ensure our cleanup function got called. */
	assertEqualInt(gmagic, 0x2468);

	/* Same thing with uname lookup.... */
	assertEqualInt(ARCHIVE_OK, archive_write_disk_set_user_lookup(a,
			   &umagic, &user_lookup, &user_cleanup));
	assertEqualInt(2, archive_write_disk_uid(a, "FOO", 0));
	assertEqualInt(74, archive_write_disk_uid(a, "NOTFOO", 1));
	assertEqualInt(ARCHIVE_OK,
	    archive_write_disk_set_user_lookup(a, NULL, NULL, NULL));
	assertEqualInt(umagic, 0x2345);

	/* Try the standard lookup functions. */
	if (archive_write_disk_set_standard_lookup(a) != ARCHIVE_OK) {
		skipping("standard uname/gname lookup");
	} else {
		/* Try a few common names for group #0. */
		id = archive_write_disk_gid(a, "wheel", 8);
		if (id != 0)
			id = archive_write_disk_gid(a, "root", 8);
		failure("Unable to verify lookup of group #0");
#if defined(_WIN32) && !defined(__CYGWIN__)
		/* Not yet implemented on Windows. */
		assertEqualInt(8, id);
#else
		assertEqualInt(0, id);
#endif

		/* Try a few common names for user #0. */
		id = archive_write_disk_uid(a, "root", 8);
		failure("Unable to verify lookup of user #0");
#if defined(_WIN32) && !defined(__CYGWIN__)
		/* Not yet implemented on Windows. */
		assertEqualInt(8, id);
#else
		assertEqualInt(0, id);
#endif
	}

	/* Deregister again and verify the default lookups again. */
	assertEqualInt(ARCHIVE_OK,
	    archive_write_disk_set_group_lookup(a, NULL, NULL, NULL));
	assertEqualInt(ARCHIVE_OK,
	    archive_write_disk_set_user_lookup(a, NULL, NULL, NULL));
	assertEqualInt(0, archive_write_disk_gid(a, "", 0));
	assertEqualInt(0, archive_write_disk_uid(a, "", 0));

	/* Re-register our custom handlers. */
	gmagic = 0x13579;
	umagic = 0x1234;
	assertEqualInt(ARCHIVE_OK, archive_write_disk_set_group_lookup(a,
			   &gmagic, &group_lookup, &group_cleanup));
	assertEqualInt(ARCHIVE_OK, archive_write_disk_set_user_lookup(a,
		      &umagic, &user_lookup, &user_cleanup));

	/* Destroy the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/* Verify our cleanup functions got called. */
	assertEqualInt(gmagic, 0x2468);
	assertEqualInt(umagic, 0x2345);
}